

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  bool bVar9;
  __type _Var10;
  char *pcVar11;
  long lVar12;
  pointer pp_Var13;
  undefined1 local_1a8 [32];
  TemplateDictionaryPeer peer;
  string dump;
  char *local_160;
  undefined8 local_158;
  char local_150 [16];
  pointer local_140;
  undefined8 uStack_138;
  undefined1 local_130;
  uint7 uStack_12f;
  undefined8 uStack_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  undefined8 uStack_118;
  undefined1 local_110;
  uint7 uStack_10f;
  undefined8 uStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  undefined8 uStack_f8;
  char local_f0;
  undefined2 uStack_ef;
  undefined4 uStack_ed;
  undefined1 uStack_e9;
  undefined8 uStack_e8;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateDictionary dict;
  size_t sStack_98;
  undefined8 local_90;
  TemplateId TStack_88;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"GLOBAL");
  ctemplate::TemplateString::TemplateString(&local_c0,"top");
  TVar6._17_7_ = local_c0._17_7_;
  TVar6.is_immutable_ = local_c0.is_immutable_;
  TVar3.length_ = sStack_98;
  TVar3.ptr_ = _dict;
  TVar3._16_8_ = local_90;
  TVar3.id_ = TStack_88;
  TVar6.length_ = local_c0.length_;
  TVar6.ptr_ = local_c0.ptr_;
  TVar6.id_ = local_c0.id_;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar3,TVar6);
  lVar12 = -(long)g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
                  super__Vector_impl_data._M_start;
  for (pp_Var13 = g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pp_Var13 !=
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish; pp_Var13 = pp_Var13 + 1) {
    (**pp_Var13)();
    lVar12 = lVar12 + -8;
  }
  fprintf(_stderr,"\nPassed %d tests\n\nPASS\n",
          (ulong)-(lVar12 + (long)g_testlist.
                                  super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  ctemplate::TemplateString::TemplateString(&local_c0,"test_SetValueWithNUL");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_c0,(UnsafeArena *)0x0);
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_f0;
  local_f0 = 'F';
  uStack_ef = 0x4f4f;
  uStack_ed = 0x52414200;
  uStack_f8 = 7;
  uStack_e9 = 0;
  local_c0.length_ = 7;
  local_c0.is_immutable_ = false;
  local_c0.id_ = 0;
  paVar1 = &dump.field_2;
  dump.field_2._M_allocated_capacity = 0x5855555100585551;
  dump._M_string_length = 8;
  dump.field_2._8_8_ = dump.field_2._8_8_ & 0xffffffffffffff00;
  uStack_118 = 8;
  local_110 = 0;
  uStack_108 = 0;
  TVar4.length_ = 7;
  TVar4.ptr_ = (char *)local_100;
  TVar4._16_8_ = (ulong)(uint7)local_c0._17_7_ << 8;
  TVar4.id_ = 0;
  TVar7.length_ = 8;
  TVar7.ptr_ = (char *)paVar1;
  TVar7._16_8_ = (ulong)uStack_10f << 8;
  TVar7.id_ = 0;
  peer.dict_ = &dict;
  dump._M_dataplus._M_p = (pointer)paVar1;
  local_120 = paVar1;
  local_c0.ptr_ = (char *)local_100;
  ctemplate::TemplateDictionary::SetValue(TVar4,TVar7);
  std::__cxx11::string::~string((string *)&dump);
  std::__cxx11::string::~string((string *)&local_100);
  dump._M_string_length = 7;
  uStack_f8 = 7;
  local_f0 = '\0';
  uStack_e8 = 0;
  dump.field_2._M_allocated_capacity = 0x524147004f4f47;
  pcVar2 = local_1a8 + 0x10;
  local_1a8._16_8_ = 0x5855554700585547;
  local_1a8._8_8_ = 8;
  local_1a8[0x18] = '\0';
  uStack_138 = 8;
  local_130 = 0;
  uStack_128 = 0;
  TVar5.length_ = 7;
  TVar5.ptr_ = (char *)paVar1;
  TVar5._16_8_ = (ulong)CONCAT16(uStack_e9,CONCAT42(uStack_ed,uStack_ef)) << 8;
  TVar5.id_ = 0;
  TVar8.length_ = 8;
  TVar8.ptr_ = pcVar2;
  TVar8._16_8_ = (ulong)uStack_12f << 8;
  TVar8.id_ = 0;
  local_1a8._0_8_ = pcVar2;
  dump._M_dataplus._M_p = (pointer)paVar1;
  local_140 = pcVar2;
  local_100 = paVar1;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar5,TVar8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&dump);
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"FOO");
  ctemplate::TemplateString::TemplateString((TemplateString *)local_1a8,"");
  bVar9 = ctemplate::TemplateDictionaryPeer::ValueIs
                    (&peer,(TemplateString *)&dump,(TemplateString *)local_1a8);
  if (bVar9) {
    ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"GOO");
    ctemplate::TemplateString::TemplateString((TemplateString *)local_1a8,"");
    bVar9 = ctemplate::TemplateDictionaryPeer::ValueIs
                      (&peer,(TemplateString *)&dump,(TemplateString *)local_1a8);
    if (bVar9) {
      local_1a8._8_8_ = 7;
      local_1a8._16_8_ = 0x524142004f4f46;
      dump._M_string_length = 7;
      dump.field_2._M_allocated_capacity = dump.field_2._M_allocated_capacity & 0xffffffffffffff00;
      dump.field_2._8_8_ = 0;
      builtin_strncpy(local_150,"QUX",4);
      builtin_strncpy(local_150 + 4,"QUUX",5);
      local_158 = 8;
      local_e0.length_ = 8;
      local_e0.is_immutable_ = false;
      local_e0.id_ = 0;
      local_1a8._0_8_ = pcVar2;
      dump._M_dataplus._M_p = pcVar2;
      local_160 = local_150;
      local_e0.ptr_ = local_150;
      bVar9 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,(TemplateString *)&dump,&local_e0);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)local_1a8);
      if (bVar9) {
        local_1a8._8_8_ = 7;
        dump._M_string_length = 7;
        dump.field_2._M_allocated_capacity = dump.field_2._M_allocated_capacity & 0xffffffffffffff00
        ;
        dump.field_2._8_8_ = 0;
        local_1a8._16_8_ = 0x524147004f4f47;
        builtin_strncpy(local_150,"GUX",4);
        builtin_strncpy(local_150 + 4,"GUUX",5);
        local_158 = 8;
        local_e0.length_ = 8;
        local_e0.is_immutable_ = false;
        local_e0.id_ = 0;
        local_1a8._0_8_ = pcVar2;
        dump._M_dataplus._M_p = pcVar2;
        local_160 = local_150;
        local_e0.ptr_ = local_150;
        bVar9 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,(TemplateString *)&dump,&local_e0);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)local_1a8);
        if (bVar9) {
          dump._M_string_length = 0;
          dump.field_2._M_allocated_capacity =
               dump.field_2._M_allocated_capacity & 0xffffffffffffff00;
          dump._M_dataplus._M_p = (pointer)paVar1;
          ctemplate::TemplateDictionary::DumpToString((string *)&dict,(int)&dump);
          local_1a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n   GOO"
                     ,"");
          _Var10 = std::operator==(&dump,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1a8);
          if (_Var10) {
            std::__cxx11::string::~string((string *)local_1a8);
            std::__cxx11::string::~string((string *)&dump);
            ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
            return 0;
          }
          fprintf(_stderr,"Check failed: %s %s %s\n","dump","==","expected");
          goto LAB_00108eea;
        }
        pcVar11 = "peer.ValueIs(string(\"GOO\\0GAR\", 7), string(\"GUX\\0GUUX\", 8))";
      }
      else {
        pcVar11 = "peer.ValueIs(string(\"FOO\\0BAR\", 7), string(\"QUX\\0QUUX\", 8))";
      }
    }
    else {
      pcVar11 = "peer.ValueIs(\"GOO\", \"\")";
    }
  }
  else {
    pcVar11 = "peer.ValueIs(\"FOO\", \"\")";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar11);
LAB_00108eea:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {

  SetUp();

  const int retval = RUN_ALL_TESTS();

  // This has to run last, so we run it manually
  TestSetValueWithNUL();

  return retval;
}